

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

String * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::toString
          (String *__return_storage_ptr__,NetworkAddressImpl *this)

{
  size_t sVar1;
  long lVar2;
  char *delim;
  SocketAddress *this_00;
  undefined8 *puVar3;
  Array<kj::String> result;
  undefined8 *local_88;
  long lStack_80;
  undefined8 *local_78;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  String local_48;
  
  sVar1 = (this->addrs).size_;
  delim = (char *)0x0;
  local_88 = (undefined8 *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x18,0,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58 = local_88 + sVar1 * 3;
  local_50 = &kj::_::HeapArrayDisposer::instance;
  puVar3 = local_88;
  local_68 = local_88;
  if ((this->addrs).size_ != 0) {
    this_00 = (this->addrs).ptr;
    do {
      local_60 = puVar3;
      SocketAddress::toString(&local_48,this_00);
      *puVar3 = local_48.content.ptr;
      puVar3[1] = local_48.content.size_;
      puVar3[2] = local_48.content.disposer;
      puVar3 = puVar3 + 3;
      this_00 = this_00 + 1;
      sVar1 = (this->addrs).size_;
      delim = (char *)(sVar1 * 0x80);
    } while (this_00 != (this->addrs).ptr + sVar1);
  }
  lStack_80 = ((long)puVar3 - (long)local_88 >> 3) * -0x5555555555555555;
  local_78 = &kj::_::HeapArrayDisposer::instance;
  local_60 = puVar3;
  strArray<kj::Array<kj::String>>
            (__return_storage_ptr__,(kj *)&local_88,(Array<kj::String> *)0x4d9997,delim);
  lVar2 = lStack_80;
  puVar3 = local_88;
  if (local_88 != (undefined8 *)0x0) {
    local_88 = (undefined8 *)0x0;
    lStack_80 = 0;
    (**(code **)*local_78)
              (local_78,puVar3,0x18,lVar2,lVar2,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString() override {
    return strArray(KJ_MAP(addr, addrs) { return addr.toString(); }, ",");
  }